

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_test.cc
# Opt level: O2

void __thiscall
fizplex::BaseTestRegularNoReordering_ForwardTransformDVector_Test::TestBody
          (BaseTestRegularNoReordering_ForwardTransformDVector_Test *this)

{
  Base *this_00;
  DVector *vec;
  DVector *vec_00;
  DVector *vec_01;
  char *pcVar1;
  initializer_list<double> l;
  initializer_list<double> l_00;
  initializer_list<double> l_01;
  AssertionResult gtest_ar;
  DVector local_50;
  AssertHelper local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  
  this_00 = &(this->super_BaseTestRegularNoReordering).b;
  vec = &(this->super_BaseTestRegularNoReordering).dv0;
  Base::ftran(this_00,vec);
  vec_00 = &(this->super_BaseTestRegularNoReordering).dv1;
  Base::ftran(this_00,vec_00);
  vec_01 = &(this->super_BaseTestRegularNoReordering).dv2;
  Base::ftran(this_00,vec_01);
  local_38.data_ = (AssertHelperData *)0xc000000000000000;
  uStack_30 = 0x4008000000000000;
  local_28 = 0x4022000000000000;
  l._M_len = 3;
  l._M_array = (iterator)&local_38;
  DVector::DVector(&local_50,l);
  testing::internal::CmpHelperEQ<fizplex::DVector,fizplex::DVector>
            ((internal *)&gtest_ar,"DVector({-2, 3, 9})","dv0",&local_50,vec);
  operator_delete(local_50.vals._M_data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x2c,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_38.data_ = (AssertHelperData *)0x4020000000000000;
  uStack_30 = 0xc026000000000000;
  local_28 = 0xc041000000000000;
  l_00._M_len = 3;
  l_00._M_array = (iterator)&local_38;
  DVector::DVector(&local_50,l_00);
  testing::internal::CmpHelperEQ<fizplex::DVector,fizplex::DVector>
            ((internal *)&gtest_ar,"DVector({8, -11, -34})","dv1",&local_50,vec_00);
  operator_delete(local_50.vals._M_data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x2d,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_38.data_ = (AssertHelperData *)0xc014000000000000;
  uStack_30 = 0x401c000000000000;
  local_28 = 0x4035000000000000;
  l_01._M_len = 3;
  l_01._M_array = (iterator)&local_38;
  DVector::DVector(&local_50,l_01);
  testing::internal::CmpHelperEQ<fizplex::DVector,fizplex::DVector>
            ((internal *)&gtest_ar,"DVector({-5, 7, 21})","dv2",&local_50,vec_01);
  operator_delete(local_50.vals._M_data);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_50);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/base_test.cc"
               ,0x2e,pcVar1);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_50);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(BaseTestRegularNoReordering, ForwardTransformDVector) {
  b.ftran(dv0);
  b.ftran(dv1);
  b.ftran(dv2);
  EXPECT_EQ(DVector({-2, 3, 9}), dv0);
  EXPECT_EQ(DVector({8, -11, -34}), dv1);
  EXPECT_EQ(DVector({-5, 7, 21}), dv2);
}